

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

void __thiscall cs::function::function(function *this,function *param_1)

{
  bool bVar1;
  
  std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> *)param_1);
  this->mIsLambda = param_1->mIsLambda;
  bVar1 = param_1->mIsVargs;
  this->mIsMemFn = param_1->mIsMemFn;
  this->mIsVargs = bVar1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->mArgs,&param_1->mArgs);
  std::deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>::deque
            (&this->mBody,&param_1->mBody);
  this->call_ptr = param_1->call_ptr;
  return;
}

Assistant:

function(const function &) = default;